

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O2

void X86_Intel_printInst(MCInst *MI,SStream *O,void *Info)

{
  uint8_t *puVar1;
  char cVar2;
  cs_detail *pcVar3;
  cs_struct *h;
  _Bool _Var4;
  uint uVar5;
  x86_reg xVar6;
  MCOperand *pMVar7;
  int64_t iVar8;
  MCRegisterClass *c;
  char *s;
  MCRegisterInfo *extraout_RDX;
  MCRegisterInfo *extraout_RDX_00;
  MCRegisterInfo *extraout_RDX_01;
  MCRegisterInfo *extraout_RDX_02;
  MCRegisterInfo *extraout_RDX_03;
  MCRegisterInfo *extraout_RDX_04;
  MCRegisterInfo *extraout_RDX_05;
  MCRegisterInfo *extraout_RDX_06;
  MCRegisterInfo *extraout_RDX_07;
  MCRegisterInfo *extraout_RDX_08;
  MCRegisterInfo *extraout_RDX_09;
  MCRegisterInfo *extraout_RDX_10;
  MCRegisterInfo *extraout_RDX_11;
  MCRegisterInfo *extraout_RDX_12;
  MCRegisterInfo *extraout_RDX_13;
  MCRegisterInfo *MRI;
  MCRegisterInfo *extraout_RDX_14;
  char *pcVar9;
  char *pcVar10;
  cs_ac_type access1;
  x86_reg reg;
  uint8_t access [6];
  cs_ac_type access2;
  x86_reg reg2;
  
  if (MI->assembly[0] != '\0') {
    strncpy(O->buffer,MI->assembly,0x200);
    return;
  }
  uVar5 = MCInst_getOpcode(MI);
  if (uVar5 == 0x2291) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_09;
    if (uVar5 == 0) {
      pcVar9 = "xstorerng";
LAB_00220235:
      s = cs_strdup(pcVar9);
      for (pcVar9 = s; cVar2 = *pcVar9, cVar2 != '\0'; pcVar9 = pcVar9 + 1) {
        if ((cVar2 == ' ') || (cVar2 == '\t')) {
          *pcVar9 = '\0';
          pcVar9 = pcVar9 + 1;
          break;
        }
      }
      SStream_concat0(O,s);
      MRI = extraout_RDX_10;
      if (*pcVar9 != '\0') {
        SStream_concat0(O,anon_var_dwarf_2d80f8 + 0x11);
        MRI = extraout_RDX_11;
        do {
          cVar2 = *pcVar9;
          if (cVar2 == '$') {
            if (pcVar9[1] == -1) {
              pcVar10 = pcVar9 + 3;
              if (pcVar9[3] == '\x01') {
                printf64mem(MI,(int)pcVar9[2] - 1,O);
                MRI = extraout_RDX_14;
              }
            }
            else {
              pcVar10 = pcVar9 + 1;
              printOperand(MI,(int)pcVar9[1] - 1,O);
              MRI = extraout_RDX_13;
            }
          }
          else {
            if (cVar2 == '\0') break;
            SStream_concat(O,"%c",(ulong)(uint)(int)cVar2);
            MRI = extraout_RDX_12;
            pcVar10 = pcVar9;
          }
          pcVar9 = pcVar10 + 1;
        } while( true );
      }
      if (s != (char *)0x0) {
        (*cs_mem_free)(s);
        goto LAB_0022030a;
      }
    }
  }
  else if (uVar5 == 0x18) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_03;
    if (uVar5 == 1) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      MRI = extraout_RDX_04;
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar8 = MCOperand_getImm(pMVar7);
        MRI = extraout_RDX_05;
        if (iVar8 == 10) {
          pcVar9 = "aam";
          goto LAB_00220235;
        }
      }
    }
  }
  else if (uVar5 == 0x272) {
    uVar5 = MCInst_getNumOperands(MI);
    MRI = extraout_RDX_06;
    if (uVar5 == 6) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isReg(pMVar7);
      MRI = extraout_RDX_07;
      if (_Var4) {
        c = MCRegisterInfo_getRegClass((MCRegisterInfo *)Info,0x2a);
        pMVar7 = MCInst_getOperand(MI,0);
        uVar5 = MCOperand_getReg(pMVar7);
        _Var4 = MCRegisterClass_contains(c,uVar5);
        MRI = extraout_RDX_08;
        if (_Var4) {
          pcVar9 = anon_var_dwarf_3678a9;
          goto LAB_00220235;
        }
      }
    }
  }
  else {
    MRI = extraout_RDX;
    if ((uVar5 == 0x17) && (uVar5 = MCInst_getNumOperands(MI), MRI = extraout_RDX_00, uVar5 == 1)) {
      pMVar7 = MCInst_getOperand(MI,0);
      _Var4 = MCOperand_isImm(pMVar7);
      MRI = extraout_RDX_01;
      if (_Var4) {
        pMVar7 = MCInst_getOperand(MI,0);
        iVar8 = MCOperand_getImm(pMVar7);
        MRI = extraout_RDX_02;
        if (iVar8 == 10) {
          pcVar9 = "aad";
          goto LAB_00220235;
        }
      }
    }
  }
  printInstruction(MI,O,MRI);
LAB_0022030a:
  uVar5 = MCInst_getOpcode(MI);
  xVar6 = X86_insn_reg_intel(uVar5,&access1);
  reg = xVar6;
  if (MI->csh->detail != CS_OPT_OFF) {
    access[4] = '\0';
    access[5] = '\0';
    access[0] = '\0';
    access[1] = '\0';
    access[2] = '\0';
    access[3] = '\0';
    if (xVar6 == X86_REG_INVALID) {
      uVar5 = MCInst_getOpcode(MI);
      _Var4 = X86_insn_reg_intel2(uVar5,&reg,&access1,&reg2,&access2);
      if (_Var4) {
        (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = reg;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[reg];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = (undefined1)access1;
        (MI->flat_insn->detail->field_6).x86.operands[1].type = X86_OP_REG;
        (MI->flat_insn->detail->field_6).x86.operands[1].field_1.reg = reg2;
        *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x98) = MI->csh->regsize_map[reg2];
        *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x99) = (undefined1)access2;
        (MI->flat_insn->detail->field_6).x86.op_count = '\x02';
      }
    }
    else {
      pcVar3 = MI->flat_insn->detail;
      memmove((void *)((long)&pcVar3->field_6 + 0x78),(void *)((long)&pcVar3->field_6 + 0x48),0x150)
      ;
      (MI->flat_insn->detail->field_6).x86.operands[0].type = X86_OP_REG;
      (MI->flat_insn->detail->field_6).x86.operands[0].field_1.reg = xVar6;
      *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x68) = MI->csh->regsize_map[xVar6];
      *(undefined1 *)((long)&MI->flat_insn->detail->field_6 + 0x69) = (undefined1)access1;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
    h = MI->csh;
    uVar5 = MCInst_getOpcode(MI);
    get_op_access(h,uVar5,access,&(MI->flat_insn->detail->field_6).x86.field_15.eflags);
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x69) = access[0];
    *(uint8_t *)((long)&MI->flat_insn->detail->field_6 + 0x99) = access[1];
  }
  if (reg != X86_REG_INVALID && MI->op1_size == '\0') {
    MI->op1_size = MI->csh->regsize_map[reg];
  }
  return;
}

Assistant:

void X86_Intel_printInst(MCInst *MI, SStream *O, void *Info)
{
#ifndef CAPSTONE_DIET
	char *mnem;
#endif
	x86_reg reg, reg2;
	enum cs_ac_type access1, access2;

	// perhaps this instruction does not need printer
	if (MI->assembly[0]) {
		strncpy(O->buffer, MI->assembly, sizeof(O->buffer));
		return;
	}

#ifndef CAPSTONE_DIET
	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, Info);
	if (mnem)
		cs_mem_free(mnem);
	else
#endif
		printInstruction(MI, O, Info);

	reg = X86_insn_reg_intel(MCInst_getOpcode(MI), &access1);
	if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
		uint8_t access[6] = {0};
#endif

		// first op can be embedded in the asm by llvm.
		// so we have to add the missing register as the first operand
		if (reg) {
			// shift all the ops right to leave 1st slot for this new register op
			memmove(&(MI->flat_insn->detail->x86.operands[1]), &(MI->flat_insn->detail->x86.operands[0]),
					sizeof(MI->flat_insn->detail->x86.operands[0]) * (ARR_SIZE(MI->flat_insn->detail->x86.operands) - 1));
			MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
			MI->flat_insn->detail->x86.operands[0].reg = reg;
			MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
			MI->flat_insn->detail->x86.operands[0].access = access1;
			MI->flat_insn->detail->x86.op_count++;
		} else {
			if (X86_insn_reg_intel2(MCInst_getOpcode(MI), &reg, &access1, &reg2, &access2)) {
				MI->flat_insn->detail->x86.operands[0].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[0].reg = reg;
				MI->flat_insn->detail->x86.operands[0].size = MI->csh->regsize_map[reg];
				MI->flat_insn->detail->x86.operands[0].access = access1;
				MI->flat_insn->detail->x86.operands[1].type = X86_OP_REG;
				MI->flat_insn->detail->x86.operands[1].reg = reg2;
				MI->flat_insn->detail->x86.operands[1].size = MI->csh->regsize_map[reg2];
				MI->flat_insn->detail->x86.operands[1].access = access2;
				MI->flat_insn->detail->x86.op_count = 2;
			}
		}

#ifndef CAPSTONE_DIET
		get_op_access(MI->csh, MCInst_getOpcode(MI), access, &MI->flat_insn->detail->x86.eflags);
		MI->flat_insn->detail->x86.operands[0].access = access[0];
		MI->flat_insn->detail->x86.operands[1].access = access[1];
#endif
	}

	if (MI->op1_size == 0 && reg)
		MI->op1_size = MI->csh->regsize_map[reg];
}